

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::IsSubDirectory(string *cSubdir,string *cDir)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 local_90 [8];
  string s;
  undefined1 local_60 [8];
  string dir;
  string subdir;
  string *cDir_local;
  string *cSubdir_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    return false;
  }
  std::__cxx11::string::string((string *)(dir.field_2._M_local_buf + 8),(string *)cSubdir);
  std::__cxx11::string::string((string *)local_60,(string *)cDir);
  ConvertToUnixSlashes((string *)((long)&dir.field_2 + 8));
  ConvertToUnixSlashes((string *)local_60);
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < uVar1) {
    std::__cxx11::string::size();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&dir.field_2 + 8));
    if (*pcVar3 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_90,(ulong)((long)&dir.field_2 + 8));
      cSubdir_local._7_1_ = ComparePath((string *)local_90,(string *)local_60);
      std::__cxx11::string::~string((string *)local_90);
      goto LAB_007b7698;
    }
  }
  cSubdir_local._7_1_ = false;
LAB_007b7698:
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
  return cSubdir_local._7_1_;
}

Assistant:

bool SystemTools::IsSubDirectory(const std::string& cSubdir, const std::string& cDir)
{
  if(cDir.empty())
    {
    return false;
    }
  std::string subdir = cSubdir;
  std::string dir = cDir;
  SystemTools::ConvertToUnixSlashes(subdir);
  SystemTools::ConvertToUnixSlashes(dir);
  if(subdir.size() > dir.size() && subdir[dir.size()] == '/')
    {
    std::string s = subdir.substr(0, dir.size());
    return SystemTools::ComparePath(s, dir);
    }
  return false;
}